

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QDate __thiscall
QtPrivate::QCalendarYearValidator::applyToDate
          (undefined8 param_1,undefined8 param_2,undefined8 param_3)

{
  long lVar1;
  QDate QVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [12];
  int iStack_34;
  QCalendar cal_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _cal_local = param_3;
  auVar3 = QCalendar::partsFromDate((QDate)&cal_local);
  if (auVar3._0_8_ >> 0x20 == 0x80000000) {
    QVar2.jd = -0x8000000000000000;
  }
  else {
    iStack_34 = auVar3._4_4_;
    QCalendar::daysInMonth((int)(YearMonthDay *)&cal_local,iStack_34);
    QVar2.jd = QCalendar::dateFromParts((YearMonthDay *)&cal_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDate)QVar2.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarYearValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    // This widget does not support negative years (some calendars may support)
    parts.year = qMax(1, m_year);
    parts.day = qMin(parts.day, cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}